

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

void __thiscall icu_63::RuleBasedTimeZone::deleteTransitions(RuleBasedTimeZone *this)

{
  UBool UVar1;
  void *buffer;
  Transition *trs;
  RuleBasedTimeZone *this_local;
  
  if (this->fHistoricTransitions != (UVector *)0x0) {
    while (UVar1 = UVector::isEmpty(this->fHistoricTransitions), UVar1 == '\0') {
      buffer = UVector::orphanElementAt(this->fHistoricTransitions,0);
      uprv_free_63(buffer);
    }
    if (this->fHistoricTransitions != (UVector *)0x0) {
      (*(this->fHistoricTransitions->super_UObject)._vptr_UObject[1])();
    }
  }
  this->fHistoricTransitions = (UVector *)0x0;
  return;
}

Assistant:

void
RuleBasedTimeZone::deleteTransitions(void) {
    if (fHistoricTransitions != NULL) {
        while (!fHistoricTransitions->isEmpty()) {
            Transition *trs = (Transition*)fHistoricTransitions->orphanElementAt(0);
            uprv_free(trs);
        }
        delete fHistoricTransitions;
    }
    fHistoricTransitions = NULL;
}